

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O2

void __thiscall
VW::object_pool<example,_example_initializer>::new_chunk
          (object_pool<example,_example_initializer> *this,size_t size)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  example_predict *this_00;
  bool bVar5;
  pair<example_*,_example_*> local_40;
  
  if (size != 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = size;
    uVar4 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x68d0),8) == 0) {
      uVar4 = SUB168(auVar2 * ZEXT816(0x68d0),0);
    }
    local_40.first = (example *)operator_new__(uVar4);
    lVar3 = 0;
    do {
      example_predict::example_predict
                ((example_predict *)
                 ((long)((local_40.first)->super_example_predict).feature_space + lVar3 + -0x20));
      lVar3 = lVar3 + 0x68d0;
    } while (size * 0x68d0 - lVar3 != 0);
    std::
    vector<std::unique_ptr<example[],std::default_delete<example[]>>,std::allocator<std::unique_ptr<example[],std::default_delete<example[]>>>>
    ::emplace_back<std::unique_ptr<example[],std::default_delete<example[]>>>
              ((vector<std::unique_ptr<example[],std::default_delete<example[]>>,std::allocator<std::unique_ptr<example[],std::default_delete<example[]>>>>
                *)&this->m_chunks,
               (unique_ptr<example[],_std::default_delete<example[]>_> *)&local_40);
    std::unique_ptr<example[],_std::default_delete<example[]>_>::~unique_ptr
              ((unique_ptr<example[],_std::default_delete<example[]>_> *)&local_40);
    puVar1 = (this->m_chunks).
             super__Vector_base<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_40.first =
         puVar1[-1]._M_t.super___uniq_ptr_impl<example,_std::default_delete<example[]>_>._M_t.
         super__Tuple_impl<0UL,_example_*,_std::default_delete<example[]>_>.
         super__Head_base<0UL,_example_*,_false>._M_head_impl;
    local_40.second = local_40.first + size + -1;
    std::vector<std::pair<example*,example*>,std::allocator<std::pair<example*,example*>>>::
    emplace_back<std::pair<example*,example*>>
              ((vector<std::pair<example*,example*>,std::allocator<std::pair<example*,example*>>> *)
               &this->m_chunk_bounds,&local_40);
    lVar3 = 0;
    while (bVar5 = size != 0, size = size - 1, bVar5) {
      memset((void *)((long)((puVar1[-1]._M_t.
                              super___uniq_ptr_impl<example,_std::default_delete<example[]>_>._M_t.
                              super__Tuple_impl<0UL,_example_*,_std::default_delete<example[]>_>.
                              super__Head_base<0UL,_example_*,_false>._M_head_impl)->
                            super_example_predict).feature_space + lVar3 + 0xffffffffffffffe0U),0,
             0x68d0);
      this_00 = (example_predict *)
                ((long)((puVar1[-1]._M_t.
                         super___uniq_ptr_impl<example,_std::default_delete<example[]>_>._M_t.
                         super__Tuple_impl<0UL,_example_*,_std::default_delete<example[]>_>.
                         super__Head_base<0UL,_example_*,_false>._M_head_impl)->
                       super_example_predict).feature_space + lVar3 + 0xffffffffffffffe0U);
      memset(this_00,0,0x68d0);
      example_predict::example_predict(this_00);
      local_40.first =
           example_initializer::operator()
                     ((example_initializer *)&this->field_0xa8,
                      (example *)
                      ((long)((puVar1[-1]._M_t.
                               super___uniq_ptr_impl<example,_std::default_delete<example[]>_>._M_t.
                               super__Tuple_impl<0UL,_example_*,_std::default_delete<example[]>_>.
                               super__Head_base<0UL,_example_*,_false>._M_head_impl)->
                             super_example_predict).feature_space + lVar3 + 0xffffffffffffffe0U));
      std::deque<example*,std::allocator<example*>>::emplace_back<example*>
                ((deque<example*,std::allocator<example*>> *)&this->m_pool,&local_40.first);
      lVar3 = lVar3 + 0x68d0;
    }
  }
  return;
}

Assistant:

void new_chunk(size_t size)
  {
    if(size == 0)
    {
      return;
    }

    m_chunks.push_back(std::unique_ptr<T[]>(new T[size]));
    auto& chunk = m_chunks.back();
    m_chunk_bounds.push_back({&chunk[0], &chunk[size - 1]});

    for (size_t i = 0; i < size; i++)
    {
      memset(&chunk[i], 0, sizeof(T));
      new (&chunk[i]) T{};
      m_pool.push(m_initializer(&chunk[i]));
    }
  }